

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall cs::token_value::dump(token_value *this,ostream *o)

{
  size_type sVar1;
  bool bVar2;
  type_info *ptVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  size_t sVar5;
  ostream *poVar6;
  MappedConstReference<phmap::priv::FlatHashMapPolicy<char,_char>_> pcVar7;
  size_type sVar8;
  char cVar9;
  char *pcVar10;
  var *this_00;
  char ch;
  pointer local_38;
  
  std::operator<<(o,"< Value = ");
  this_00 = &this->mVal;
  ptVar3 = cs_impl::any::type(this_00);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar2) {
    std::operator<<(o,"\"");
    pbVar4 = cs_impl::any::const_val<std::__cxx11::string>(this_00);
    local_38 = (pbVar4->_M_dataplus)._M_p;
    sVar1 = pbVar4->_M_string_length;
    for (sVar8 = 0; sVar1 != sVar8; sVar8 = sVar8 + 1) {
      ch = local_38[sVar8];
      sVar5 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
              ::count<char>((raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                             *)escape_char,&ch);
      poVar6 = o;
      cVar9 = ch;
      if (sVar5 != 0) {
        poVar6 = std::operator<<(o,'\\');
        pcVar7 = phmap::priv::
                 raw_hash_map<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
                 ::at<char,phmap::priv::FlatHashMapPolicy<char,char>>
                           ((raw_hash_map<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
                             *)escape_char,&ch);
        cVar9 = *pcVar7;
      }
      std::operator<<(poVar6,cVar9);
    }
    pcVar10 = "\"";
  }
  else {
    ptVar3 = cs_impl::any::type(this_00);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&char::typeinfo);
    if (!bVar2) {
      cs_impl::any::to_string_abi_cxx11_((string *)&ch,this_00);
      std::operator<<(o,(string *)&ch);
      std::__cxx11::string::~string((string *)&ch);
      goto LAB_0012ac29;
    }
    std::operator<<(o,"\'");
    pcVar10 = cs_impl::any::const_val<char>(this_00);
    ch = *pcVar10;
    sVar5 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
            ::count<char>((raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                           *)escape_char,&ch);
    poVar6 = o;
    cVar9 = ch;
    if (sVar5 != 0) {
      poVar6 = std::operator<<(o,'\\');
      pcVar7 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
               ::at<char,phmap::priv::FlatHashMapPolicy<char,char>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
                           *)escape_char,&ch);
      cVar9 = *pcVar7;
    }
    std::operator<<(poVar6,cVar9);
    pcVar10 = "\'";
  }
  std::operator<<(o,pcVar10);
LAB_0012ac29:
  std::operator<<(o,">");
  return true;
}

Assistant:

bool token_value::dump(std::ostream &o) const
	{
		o << "< Value = ";
		if (mVal.type() == typeid(cs::string)) {
			o << "\"";
			const cs::string &str = mVal.const_val<cs::string>();
			for (auto ch: str) {
				if (escape_char.count(ch) > 0)
					o << '\\' << escape_char.at(ch);
				else
					o << ch;
			}
			o << "\"";
		}
		else if (mVal.type() == typeid(char)) {
			o << "\'";
			char ch = mVal.const_val<char>();
			if (escape_char.count(ch) > 0)
				o << '\\' << escape_char.at(ch);
			else
				o << ch;
			o << "\'";
		}
		else
			o << mVal.to_string();
		o << ">";
		return true;
	}